

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O0

int Cloud_SupportSize(CloudManager *dd,CloudNode *n)

{
  int *support_00;
  int local_28;
  int local_24;
  int count;
  int i;
  int *support;
  CloudNode *n_local;
  CloudManager *dd_local;
  
  if ((dd->tUnique <= n) && (n < dd->tUnique + dd->nNodesAlloc)) {
    support_00 = (int *)calloc((long)dd->nVars,4);
    cloudSupport(dd,(CloudNode *)((ulong)n & 0xfffffffffffffffe),support_00);
    cloudClearMark(dd,(CloudNode *)((ulong)n & 0xfffffffffffffffe));
    local_28 = 0;
    for (local_24 = 0; local_24 < dd->nVars; local_24 = local_24 + 1) {
      if (support_00[local_24] == 1) {
        local_28 = local_28 + 1;
      }
    }
    if (support_00 != (int *)0x0) {
      free(support_00);
    }
    return local_28;
  }
  __assert_fail("(n) >= dd->tUnique && (n) < dd->tUnique+dd->nNodesAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/cloud.c"
                ,0x296,"int Cloud_SupportSize(CloudManager *, CloudNode *)");
}

Assistant:

int Cloud_SupportSize( CloudManager * dd, CloudNode * n )
{
    int * support, i, count;

    CLOUD_ASSERT(n);

    // allocate and initialize support array for cloudSupport
    support = ABC_CALLOC( int, dd->nVars );

    // compute support and clean up markers
    cloudSupport( dd, Cloud_Regular(n), support );
    cloudClearMark( dd, Cloud_Regular(n) );

    // count support variables
    count = 0;
    for ( i = 0; i < dd->nVars; i++ )
    {
        if ( support[i] == 1 )
            count++;
    }

    ABC_FREE( support );
    return count;
}